

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

logic_t __thiscall slang::SVInt::reductionAnd(SVInt *this)

{
  bool bVar1;
  uint64_t *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = (this->super_SVIntStorage).bitWidth;
  uVar3 = -(ulong)((uVar4 & 0x3f) == 0) | ~(-1L << (sbyte)(uVar4 & 0x3f));
  bVar1 = (this->super_SVIntStorage).unknownFlag;
  if (bVar1 != true) {
    if (uVar4 < 0x41) {
      uVar5 = (this->super_SVIntStorage).field_0.val;
    }
    else {
      puVar2 = (this->super_SVIntStorage).field_0.pVal;
      uVar4 = ((uVar4 + 0x3f >> 6) << (bVar1 & 0x1fU)) - 1;
      if (uVar4 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = (ulong)uVar4;
        uVar6 = 0;
        do {
          if (puVar2[uVar6] != 0xffffffffffffffff) {
            return (logic_t)'\0';
          }
          uVar6 = uVar6 + 1;
        } while (uVar5 != uVar6);
      }
      uVar5 = puVar2[uVar5];
    }
    return (logic_t)(uVar5 == uVar3);
  }
  uVar4 = uVar4 + 0x3f >> 6;
  puVar2 = (this->super_SVIntStorage).field_0.pVal;
  if (uVar4 - 1 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = (ulong)(uVar4 - 1);
    uVar6 = 0;
    do {
      if ((puVar2[uVar4 + (int)uVar6] | puVar2[uVar6]) != 0xffffffffffffffff) {
        return (logic_t)'\0';
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  return (logic_t)(((puVar2[uVar4 * 2 - 1] | puVar2[uVar5]) == uVar3) << 7);
}

Assistant:

logic_t SVInt::reductionAnd() const {
    uint64_t mask;
    bitwidth_t bitsInMsw;
    getTopWordMask(bitsInMsw, mask);

    if (unknownFlag) {
        uint32_t words = getNumWords(bitWidth, false);
        for (uint32_t i = 0; i < words - 1; i++) {
            if ((pVal[i] | pVal[i + words]) != UINT64_MAX)
                return logic_t(false);
        }
        if ((pVal[words - 1] | pVal[words * 2 - 1]) != mask)
            return logic_t(false);
        return logic_t::x;
    }

    if (isSingleWord())
        return logic_t(val == mask);
    else {
        for (uint32_t i = 0; i < getNumWords() - 1; i++) {
            if (pVal[i] != UINT64_MAX)
                return logic_t(false);
        }
        return logic_t(pVal[getNumWords() - 1] == mask);
    }
}